

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O1

void __thiscall Assimp::BVHLoader::ThrowException(BVHLoader *this,string *pError)

{
  runtime_error *this_00;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,(this->mFileName)._M_dataplus._M_p,
             (this->mFileName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," - ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,(pError->_M_dataplus)._M_p,pError->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,asStack_1b8);
  *(undefined ***)this_00 = &PTR__runtime_error_007fd498;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AI_WONT_RETURN void BVHLoader::ThrowException( const std::string& pError)
{
    throw DeadlyImportError( format() << mFileName << ":" << mLine << " - " << pError);
}